

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaping_clipper.cpp
# Opt level: O0

void __thiscall
shaping_clipper::set_margin_curve(shaping_clipper *this,int (*points) [2],int num_points)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  reference pvVar10;
  double dVar11;
  int local_24;
  int binHz;
  int i;
  int j;
  int num_points_local;
  int (*points_local) [2];
  shaping_clipper *this_local;
  
  iVar2 = (*points)[1];
  pvVar10 = std::vector<float,_std::allocator<float>_>::operator[](&this->margin_curve,0);
  *pvVar10 = (float)iVar2;
  binHz = 0;
  for (local_24 = 0; local_24 < num_points + -1; local_24 = local_24 + 1) {
    while( true ) {
      bVar9 = false;
      if (binHz < this->size / 2 + 1) {
        bVar9 = ((float)binHz * this->sample_rate) / (float)this->size <
                (float)points[local_24 + 1][0];
      }
      if (!bVar9) break;
      fVar1 = this->sample_rate;
      iVar2 = this->size;
      iVar3 = points[local_24][1];
      iVar4 = points[local_24][0];
      iVar5 = points[local_24 + 1][1];
      iVar6 = points[local_24][1];
      iVar7 = points[local_24 + 1][0];
      iVar8 = points[local_24][0];
      pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                          (&this->margin_curve,(long)binHz);
      *pvVar10 = (float)(iVar3 + (((int)(((float)binHz * fVar1) / (float)iVar2) - iVar4) *
                                 (iVar5 - iVar6)) / (iVar7 - iVar8));
      binHz = binHz + 1;
    }
  }
  for (; binHz < this->size / 2 + 1; binHz = binHz + 1) {
    iVar2 = points[num_points + -1][1];
    pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                        (&this->margin_curve,(long)binHz);
    *pvVar10 = (float)iVar2;
  }
  for (binHz = 0; binHz < this->size / 2 + 1; binHz = binHz + 1) {
    pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                        (&this->margin_curve,(long)binHz);
    dVar11 = pow(10.0,(double)(*pvVar10 / 20.0));
    pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                        (&this->margin_curve,(long)binHz);
    *pvVar10 = (float)dVar11;
  }
  return;
}

Assistant:

void shaping_clipper::set_margin_curve(int points[][2], int num_points) {
    this->margin_curve[0] = points[0][1];

    int j = 0;
    for (int i = 0; i < num_points - 1; i++) {
        while (j < this->size / 2 + 1 && j * this->sample_rate / this->size < points[i + 1][0]) {
            // linearly interpolate between points
            int binHz = j * this->sample_rate / this->size;
            margin_curve[j] = points[i][1] + (binHz - points[i][0]) * (points[i + 1][1] - points[i][1]) / (points[i + 1][0] - points[i][0]);
            j++;
        }
    }
    // handle bins after the last point
    while (j < this->size / 2 + 1) {
        margin_curve[j] = points[num_points - 1][1];
        j++;
    }

    // convert margin curve to linear amplitude scale
    for (j = 0; j < this->size / 2 + 1; j++) {
        margin_curve[j] = pow(10, margin_curve[j] / 20);
    }
}